

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

bool __thiscall sentencepiece::ModelProto::IsInitialized(ModelProto *this)

{
  bool bVar1;
  ModelProto *this_local;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if (bVar1) {
    bVar1 = google::protobuf::internal::AllAreInitialized<sentencepiece::ModelProto_SentencePiece>
                      (&this->pieces_);
    if (bVar1) {
      bVar1 = _internal_has_trainer_spec(this);
      if ((!bVar1) || (bVar1 = TrainerSpec::IsInitialized(this->trainer_spec_), bVar1)) {
        bVar1 = _internal_has_normalizer_spec(this);
        if ((!bVar1) || (bVar1 = NormalizerSpec::IsInitialized(this->normalizer_spec_), bVar1)) {
          bVar1 = _internal_has_self_test_data(this);
          if ((!bVar1) || (bVar1 = SelfTestData::IsInitialized(this->self_test_data_), bVar1)) {
            bVar1 = _internal_has_denormalizer_spec(this);
            if ((!bVar1) || (bVar1 = NormalizerSpec::IsInitialized(this->denormalizer_spec_), bVar1)
               ) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ModelProto::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  if (_internal_has_trainer_spec()) {
    if (!trainer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_normalizer_spec()) {
    if (!normalizer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_self_test_data()) {
    if (!self_test_data_->IsInitialized()) return false;
  }
  if (_internal_has_denormalizer_spec()) {
    if (!denormalizer_spec_->IsInitialized()) return false;
  }
  return true;
}